

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int rffti1_(int *n,double *wa,double *fac)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int unaff_EBX;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  int iVar12;
  double *pdVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_88;
  
  iVar3 = *n;
  uVar8 = 0;
  lVar9 = 0;
  iVar5 = iVar3;
  do {
    if (uVar8 < 4) {
      unaff_EBX = (&DAT_00132c20)[uVar8];
    }
    else {
      unaff_EBX = unaff_EBX + 2;
    }
    uVar8 = uVar8 + 1;
    pdVar11 = fac + (long)(int)lVar9 + 2;
    lVar10 = (long)(int)lVar9;
    while (lVar9 = lVar10, iVar2 = iVar5 / unaff_EBX, iVar5 == iVar2 * unaff_EBX) {
      lVar10 = lVar9 + 1;
      fac[lVar9 + 2] = (double)unaff_EBX;
      lVar7 = 2;
      pdVar13 = pdVar11;
      if (lVar9 != 0 && unaff_EBX == 2) {
        for (; lVar7 <= lVar10; lVar7 = lVar7 + 1) {
          *pdVar13 = pdVar13[-1];
          pdVar13 = pdVar13 + -1;
        }
        fac[2] = 2.0;
      }
      pdVar11 = pdVar11 + 1;
      iVar5 = iVar2;
      if (iVar2 == 1) {
        dVar14 = (double)iVar3;
        *fac = dVar14;
        fac[1] = (double)(int)lVar10;
        if (lVar9 != 0) {
          lVar10 = 0;
          iVar3 = (int)lVar9;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          iVar5 = 1;
          for (uVar8 = 1; uVar8 != iVar3 + 1; uVar8 = uVar8 + 1) {
            dVar1 = fac[uVar8 + 1];
            iVar6 = iVar5 * (int)dVar1;
            iVar4 = *n / iVar6;
            lVar10 = (long)(int)lVar10;
            pdVar11 = wa + lVar10;
            iVar12 = 0;
            for (iVar2 = 1; iVar2 < (int)dVar1; iVar2 = iVar2 + 1) {
              iVar12 = iVar12 + iVar5;
              local_88 = 0.0;
              for (lVar9 = 1; (int)lVar9 + 2 <= iVar4; lVar9 = lVar9 + 2) {
                local_88 = local_88 + 1.0;
                dVar15 = (double)iVar12 * (6.283185307179586 / dVar14) * local_88;
                dVar16 = cos(dVar15);
                pdVar11[lVar9 + -1] = dVar16;
                dVar15 = sin(dVar15);
                pdVar11[lVar9] = dVar15;
              }
              lVar10 = lVar10 + iVar4;
              pdVar11 = pdVar11 + iVar4;
            }
            iVar5 = iVar6;
          }
        }
        return 0;
      }
    }
  } while( true );
}

Assistant:

int rffti1_(int *n, fft_real_t *wa, fft_real_t *fac)
{
    /* Initialized data */

     int ntryh[4] = { 4,2,3,5 };

    /* System generated locals */
    int i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k1, l1, l2, ib;
     fft_real_t fi;
     int ld, ii, nf, ip, nl, is, nq, nr;
     fft_real_t arg;
     int ido, ipm;
     fft_real_t tpi;
     int nfm1;
     fft_real_t argh;
     int ntry;
     fft_real_t argld;

    /* Parameter adjustments */
    --wa;
    --fac;

    /* Function Body */

    nl = *n;
    nf = 0;
    j = 0;
L101:
    ++j;
    if (j - 4 <= 0) {
	goto L102;
    } else {
	goto L103;
    }
L102:
    ntry = ntryh[j - 1];
    goto L104;
L103:
    ntry += 2;
L104:
    nq = nl / ntry;
    nr = nl - ntry * nq;
    if (nr != 0) {
	goto L101;
    } else {
	goto L105;
    }
L105:
    ++nf;
    fac[nf + 2] = (fft_real_t) ntry;
    nl = nq;
    if (ntry != 2) {
	goto L107;
    }
    if (nf == 1) {
	goto L107;
    }
    i__1 = nf;
    for (i__ = 2; i__ <= i__1; ++i__) {
	ib = nf - i__ + 2;
	fac[ib + 2] = fac[ib + 1];
/* L106: */
    }
    fac[3] = 2.0;
L107:
    if (nl != 1) {
	goto L104;
    }
    fac[1] = (fft_real_t) (*n);
    fac[2] = (fft_real_t) nf;
    tpi = atan(1.) * 8.;
    argh = tpi / (fft_real_t) (*n);
    is = 0;
    nfm1 = nf - 1;
    l1 = 1;
    if (nfm1 == 0) {
	return 0;
    }
    i__1 = nfm1;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	ld = 0;
	l2 = l1 * ip;
	ido = *n / l2;
	ipm = ip - 1;
	i__2 = ipm;
	for (j = 1; j <= i__2; ++j) {
	    ld += l1;
	    i__ = is;
	    argld = (fft_real_t) ld * argh;
	    fi = 0.0;
	    i__3 = ido;
	    for (ii = 3; ii <= i__3; ii += 2) {
		i__ += 2;
		fi += 1.0;
		arg = fi * argld;
		wa[i__ - 1] = cos(arg);
		wa[i__] = sin(arg);
/* L108: */
	    }
	    is += ido;
/* L109: */
	}
	l1 = l2;
/* L110: */
    }
    return 0;
}